

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::FinalizeTargetConfiguration(cmGlobalGenerator *this)

{
  pointer puVar1;
  pointer pbVar2;
  string *psVar3;
  pointer __rhs;
  pointer puVar4;
  __node_base *p_Var5;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  cmBTStringRange noConfigCompileDefinitions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardIncludesSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardIncludesVec;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
  perConfigCompileDefinitions;
  string standardIncludesVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  cmBTStringRange local_e8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  local_d8 [8];
  undefined4 local_d0 [2];
  undefined8 local_c8;
  undefined4 *local_c0;
  undefined4 *local_b8;
  undefined8 local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cmState::GetEnabledLanguages_abi_cxx11_
            (&local_100,
             (this->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  puVar1 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->Makefiles).
                super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    local_e8 = cmMakefile::GetCompileDefinitionsEntries_abi_cxx11_
                         ((puVar4->_M_t).
                          super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                          super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
    local_88._M_engaged = false;
    p_Var5 = (__node_base *)
             ((long)&(((puVar4->_M_t).
                       super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl)->Targets)._M_h +
             0x10);
    while (pbVar2 = local_100.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, p_Var5 = p_Var5->_M_nxt,
          p_Var5 != (__node_base *)0x0) {
      cmTarget::FinalizeTargetConfiguration
                ((cmTarget *)(p_Var5 + 5),&local_e8,
                 (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                  *)&local_88);
    }
    local_d0[0] = 0;
    local_c8 = 0;
    local_c0 = local_d0;
    local_b0 = 0;
    local_b8 = local_c0;
    for (__rhs = local_100.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar2; __rhs = __rhs + 1) {
      std::operator+(&local_a8,"CMAKE_",__rhs);
      std::operator+(&local_50,&local_a8,"_STANDARD_INCLUDE_DIRECTORIES");
      std::__cxx11::string::~string((string *)&local_a8);
      psVar3 = cmMakefile::GetSafeDefinition
                         ((puVar4->_M_t).
                          super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                          super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_50);
      arg._M_str = (psVar3->_M_dataplus)._M_p;
      arg._M_len = psVar3->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_a8,arg,false);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (local_d8,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )local_a8._M_dataplus._M_p,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_a8._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
      std::__cxx11::string::~string((string *)&local_50);
    }
    cmMakefile::AddSystemIncludeDirectories
              ((puVar4->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
               _M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
               super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
    std::
    _Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
    ::_M_reset(&local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  return;
}

Assistant:

void cmGlobalGenerator::FinalizeTargetConfiguration()
{
  std::vector<std::string> const langs =
    this->CMakeInstance->GetState()->GetEnabledLanguages();

  // Construct per-target generator information.
  for (const auto& mf : this->Makefiles) {
    const cmBTStringRange noConfigCompileDefinitions =
      mf->GetCompileDefinitionsEntries();
    cm::optional<std::map<std::string, cmValue>> perConfigCompileDefinitions;

    for (auto& target : mf->GetTargets()) {
      cmTarget* t = &target.second;
      t->FinalizeTargetConfiguration(noConfigCompileDefinitions,
                                     perConfigCompileDefinitions);
    }

    // The standard include directories for each language
    // should be treated as system include directories.
    std::set<std::string> standardIncludesSet;
    for (std::string const& li : langs) {
      std::string const standardIncludesVar =
        "CMAKE_" + li + "_STANDARD_INCLUDE_DIRECTORIES";
      std::string const& standardIncludesStr =
        mf->GetSafeDefinition(standardIncludesVar);
      std::vector<std::string> standardIncludesVec =
        cmExpandedList(standardIncludesStr);
      standardIncludesSet.insert(standardIncludesVec.begin(),
                                 standardIncludesVec.end());
    }
    mf->AddSystemIncludeDirectories(standardIncludesSet);
  }
}